

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cc
# Opt level: O1

void libyuv::ScaleAddCols0_C
               (int dst_width,int boxheight,int x,int dx,uint16_t *src_ptr,uint8_t *dst_ptr)

{
  ulong uVar1;
  
  if (0 < dst_width) {
    uVar1 = 0;
    do {
      dst_ptr[uVar1] =
           (uint8_t)((uint)src_ptr[(long)(x >> 0x10) + uVar1] * (int)(0x10000 / (long)boxheight) >>
                    0x10);
      uVar1 = uVar1 + 1;
    } while ((uint)dst_width != uVar1);
  }
  return;
}

Assistant:

static void ScaleAddCols0_C(int dst_width,
                            int boxheight,
                            int x,
                            int dx,
                            const uint16_t* src_ptr,
                            uint8_t* dst_ptr) {
  int scaleval = 65536 / boxheight;
  int i;
  (void)dx;
  src_ptr += (x >> 16);
  for (i = 0; i < dst_width; ++i) {
    *dst_ptr++ = src_ptr[i] * scaleval >> 16;
  }
}